

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_map(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQArray *x;
  SQInteger SVar2;
  SQInteger SVar3;
  SQObjectPtr ret;
  
  SVar3 = 1;
  pSVar1 = stack_get(v,1);
  x = SQArray::Create(v->_sharedstate,((pSVar1->super_SQObject)._unVal.pOuter)->_idx);
  SQObjectPtr::SQObjectPtr(&ret,x);
  SVar2 = __map_array(ret.super_SQObject._unVal.pArray,(pSVar1->super_SQObject)._unVal.pArray,v);
  if (SVar2 < 0) {
    SVar3 = -1;
  }
  else {
    SQVM::Push(v,&ret);
  }
  SQObjectPtr::~SQObjectPtr(&ret);
  return SVar3;
}

Assistant:

static SQInteger array_map(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQInteger size = _array(o)->Size();
    SQObjectPtr ret = SQArray::Create(_ss(v),size);
    if(SQ_FAILED(__map_array(_array(ret),_array(o),v)))
        return SQ_ERROR;
    v->Push(ret);
    return 1;
}